

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128a.c
# Opt level: O3

size_t ascon_aead128a_encrypt_update
                 (ascon_aead_ctx_t *ctx,uint8_t *ciphertext,uint8_t *plaintext,size_t plaintext_len)

{
  size_t sVar1;
  
  if ((ctx->bufstate).flow_state != '\t') {
    ascon_128a_finalise_assoc_data(ctx);
  }
  (ctx->bufstate).flow_state = '\t';
  sVar1 = buffered_accumulation
                    (&ctx->bufstate,ciphertext,plaintext,absorb_plaintext,plaintext_len,'\x10');
  return sVar1;
}

Assistant:

ASCON_API size_t
ascon_aead128a_encrypt_update(ascon_aead_ctx_t* const ctx,
                              uint8_t* ciphertext,
                              const uint8_t* plaintext,
                              size_t plaintext_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(plaintext_len == 0 || plaintext != NULL);
    ASCON_ASSERT(plaintext_len == 0 || ciphertext != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ASSOC_DATA_UPDATED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ENCRYPT_UPDATED);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128a_ENCRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_128a_finalise_assoc_data(ctx);
    }
    ctx->bufstate.flow_state = ASCON_FLOW_AEAD128a_ENCRYPT_UPDATED;
    // Start absorbing plaintext and simultaneously squeezing out ciphertext
    return buffered_accumulation(&ctx->bufstate, ciphertext, plaintext,
                                 absorb_plaintext, plaintext_len,
                                 ASCON_DOUBLE_RATE);
}